

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

void __thiscall cimg_library::CImgDisplay::_handle_events(CImgDisplay *this,XEvent *pevent)

{
  Display *pDVar1;
  int iVar2;
  X11_info *pXVar3;
  bool is_pressed;
  uint button;
  char tmp_1;
  char tmp;
  XEvent event;
  KeySym ksym;
  int local_5c;
  
  pXVar3 = cimg::X11_attr();
  pDVar1 = pXVar3->display;
  memcpy(&event,pevent,0xc0);
  switch(event.type) {
  case 2:
    _tmp = _tmp & 0xffffff00;
    XLookupString(&event,&tmp,1,&ksym,0);
    is_pressed = true;
    goto LAB_0011ca8f;
  case 3:
    XQueryKeymap(pDVar1,&ksym);
    if ((event.xkey.keycode < 0x100) &&
       ((*(byte *)((long)&ksym + (ulong)(event.xkey.keycode >> 3)) >> (event.xkey.keycode & 7) & 1)
        != 0)) {
      return;
    }
    tmp_1 = '\0';
    XLookupString(&event,&tmp_1,1,&tmp,0);
    is_pressed = false;
    ksym._0_4_ = _tmp;
LAB_0011ca8f:
    set_key(this,(uint)ksym,is_pressed);
    break;
  case 4:
    do {
      this->_mouse_x = event.xkey.x;
      this->_mouse_y = event.xkey.y;
      if ((((this->_mouse_x < 0) || (this->_mouse_y < 0)) || ((int)this->_width <= this->_mouse_x))
         || ((int)this->_height <= this->_mouse_y)) {
        this->_mouse_y = -1;
        this->_mouse_x = this->_mouse_y;
      }
      if (event.xkey.keycode - 1 < 3) {
        set_button(this,*(uint *)(&DAT_001393d0 + (ulong)(event.xkey.keycode - 1) * 4),true);
      }
      iVar2 = XCheckWindowEvent(pDVar1,this->_window,4,&event);
    } while (iVar2 != 0);
    break;
  case 5:
    do {
      this->_mouse_x = event.xkey.x;
      this->_mouse_y = event.xkey.y;
      if (((this->_mouse_x < 0) || (this->_mouse_y < 0)) ||
         (((int)this->_width <= this->_mouse_x || ((int)this->_height <= this->_mouse_y)))) {
        this->_mouse_y = -1;
        this->_mouse_x = this->_mouse_y;
      }
      button = 1;
      switch(event.xkey.keycode) {
      case 1:
        break;
      case 2:
        button = 3;
        break;
      case 3:
        button = 2;
        break;
      case 4:
        goto LAB_0011c9fc;
      case 5:
        button = 0xffffffff;
LAB_0011c9fc:
        set_wheel(this,button);
      default:
        goto switchD_0011c9df_default;
      }
      set_button(this,button,false);
switchD_0011c9df_default:
      iVar2 = XCheckWindowEvent(pDVar1,this->_window,8,&event);
    } while (iVar2 != 0);
    break;
  case 6:
    do {
      iVar2 = XCheckWindowEvent(pDVar1,this->_window,0x40,&event);
    } while (iVar2 != 0);
    this->_mouse_x = event.xkey.x;
    this->_mouse_y = event.xkey.y;
    if (((this->_mouse_x < 0) || (this->_mouse_y < 0)) ||
       (((int)this->_width <= this->_mouse_x || ((int)this->_height <= this->_mouse_y))))
    goto LAB_0011c894;
    goto LAB_0011c8aa;
  case 7:
    do {
      iVar2 = XCheckWindowEvent(pDVar1,this->_window,0x10,&event);
    } while (iVar2 != 0);
    this->_mouse_x = event.xkey.x;
    this->_mouse_y = event.xkey.y;
    if ((((this->_mouse_x < 0) || (this->_mouse_y < 0)) || ((int)this->_width <= this->_mouse_x)) ||
       ((int)this->_height <= this->_mouse_y)) {
      this->_mouse_y = -1;
      this->_mouse_x = this->_mouse_y;
    }
    break;
  case 8:
    do {
      iVar2 = XCheckWindowEvent(pDVar1,this->_window,0x20,&event);
    } while (iVar2 != 0);
LAB_0011c894:
    this->_mouse_y = -1;
    this->_mouse_x = this->_mouse_y;
LAB_0011c8aa:
    this->_is_event = true;
LAB_0011c8b1:
    pXVar3 = cimg::X11_attr();
    pthread_cond_broadcast((pthread_cond_t *)&pXVar3->wait_event);
    break;
  case 9:
  case 10:
  case 0xb:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
    break;
  case 0xc:
    do {
      iVar2 = XCheckWindowEvent(pDVar1,this->_window,0x8000,&event);
    } while (iVar2 != 0);
    _paint(this,false);
    if (this->_is_fullscreen == true) {
      XGetWindowAttributes(pDVar1,this->_window,&ksym);
      while (local_5c != 2) {
        XSync(pDVar1,0);
      }
      XSetInputFocus(pDVar1,this->_window,2,0);
    }
    break;
  case 0x16:
    do {
      iVar2 = XCheckWindowEvent(pDVar1,this->_window,0x20000,&event);
    } while (iVar2 != 0);
    if ((event.xgraphicsexpose.major_code != 0 && event.xexpose.count != 0) &&
       ((event.xexpose.count != this->_window_width ||
        (event.xgraphicsexpose.major_code != this->_window_height)))) {
      this->_window_width = event.xexpose.count;
      this->_window_height = event.xgraphicsexpose.major_code;
      this->_mouse_y = -1;
      this->_mouse_x = this->_mouse_y;
      XResizeWindow(pDVar1,this->_window,this->_window_width,this->_window_height);
      this->_is_event = true;
      this->_is_resized = this->_is_event;
      pXVar3 = cimg::X11_attr();
      pthread_cond_broadcast((pthread_cond_t *)&pXVar3->wait_event);
    }
    if ((event.xexpose.width == this->_window_x) && (event.xexpose.height == this->_window_y)) {
      return;
    }
    this->_window_x = event.xexpose.width;
    this->_window_y = event.xexpose.height;
    this->_is_event = true;
    this->_is_moved = this->_is_event;
    goto LAB_0011c8b1;
  default:
    if (((event.type == 0x21) && (event.xfocus.mode == (int)this->_wm_protocol_atom)) &&
       (event.xexpose.count == (int)this->_wm_window_atom)) {
      pXVar3 = cimg::X11_attr();
      XUnmapWindow(pXVar3->display,this->_window);
      this->_is_event = true;
      this->_is_closed = this->_is_event;
      pXVar3 = cimg::X11_attr();
      pthread_cond_broadcast((pthread_cond_t *)&pXVar3->wait_event);
      return;
    }
  }
  return;
}

Assistant:

void _handle_events(const XEvent *const pevent) {
      Display *const dpy = cimg::X11_attr().display;
      XEvent event = *pevent;
      switch (event.type) {
      case ClientMessage : {
        if ((int)event.xclient.message_type==(int)_wm_protocol_atom &&
            (int)event.xclient.data.l[0]==(int)_wm_window_atom) {
          XUnmapWindow(cimg::X11_attr().display,_window);
          _is_closed = _is_event = true;
          pthread_cond_broadcast(&cimg::X11_attr().wait_event);
        }
      } break;
      case ConfigureNotify : {
        while (XCheckWindowEvent(dpy,_window,StructureNotifyMask,&event)) {}
        const unsigned int nw = event.xconfigure.width, nh = event.xconfigure.height;
        const int nx = event.xconfigure.x, ny = event.xconfigure.y;
        if (nw && nh && (nw!=_window_width || nh!=_window_height)) {
          _window_width = nw; _window_height = nh; _mouse_x = _mouse_y = -1;
          XResizeWindow(dpy,_window,_window_width,_window_height);
          _is_resized = _is_event = true;
          pthread_cond_broadcast(&cimg::X11_attr().wait_event);
        }
        if (nx!=_window_x || ny!=_window_y) {
          _window_x = nx; _window_y = ny; _is_moved = _is_event = true;
          pthread_cond_broadcast(&cimg::X11_attr().wait_event);
        }
      } break;
      case Expose : {
        while (XCheckWindowEvent(dpy,_window,ExposureMask,&event)) {}
        _paint(false);
        if (_is_fullscreen) {
          XWindowAttributes attr;
          XGetWindowAttributes(dpy,_window,&attr);
          while (attr.map_state!=IsViewable) XSync(dpy,0);
          XSetInputFocus(dpy,_window,RevertToParent,CurrentTime);
        }
      } break;
      case ButtonPress : {
        do {
          _mouse_x = event.xmotion.x; _mouse_y = event.xmotion.y;
          if (_mouse_x<0 || _mouse_y<0 || _mouse_x>=width() || _mouse_y>=height()) _mouse_x = _mouse_y = -1;
          switch (event.xbutton.button) {
          case 1 : set_button(1); break;
          case 3 : set_button(2); break;
          case 2 : set_button(3); break;
          }
        } while (XCheckWindowEvent(dpy,_window,ButtonPressMask,&event));
      } break;
      case ButtonRelease : {
        do {
          _mouse_x = event.xmotion.x; _mouse_y = event.xmotion.y;
          if (_mouse_x<0 || _mouse_y<0 || _mouse_x>=width() || _mouse_y>=height()) _mouse_x = _mouse_y = -1;
          switch (event.xbutton.button) {
          case 1 : set_button(1,false); break;
          case 3 : set_button(2,false); break;
          case 2 : set_button(3,false); break;
          case 4 : set_wheel(1); break;
          case 5 : set_wheel(-1); break;
          }
        } while (XCheckWindowEvent(dpy,_window,ButtonReleaseMask,&event));
      } break;
      case KeyPress : {
        char tmp = 0; KeySym ksym;
        XLookupString(&event.xkey,&tmp,1,&ksym,0);
        set_key((unsigned int)ksym,true);
      } break;
      case KeyRelease : {
        char keys_return[32];  // Check that the key has been physically unpressed.
        XQueryKeymap(dpy,keys_return);
        const unsigned int kc = event.xkey.keycode, kc1 = kc/8, kc2 = kc%8;
        const bool is_key_pressed = kc1>=32?false:(keys_return[kc1]>>kc2)&1;
        if (!is_key_pressed) {
          char tmp = 0; KeySym ksym;
          XLookupString(&event.xkey,&tmp,1,&ksym,0);
          set_key((unsigned int)ksym,false);
        }
      } break;
      case EnterNotify: {
        while (XCheckWindowEvent(dpy,_window,EnterWindowMask,&event)) {}
        _mouse_x = event.xmotion.x;
        _mouse_y = event.xmotion.y;
        if (_mouse_x<0 || _mouse_y<0 || _mouse_x>=width() || _mouse_y>=height()) _mouse_x = _mouse_y = -1;
      } break;
      case LeaveNotify : {
        while (XCheckWindowEvent(dpy,_window,LeaveWindowMask,&event)) {}
        _mouse_x = _mouse_y =-1; _is_event = true;
        pthread_cond_broadcast(&cimg::X11_attr().wait_event);
      } break;
      case MotionNotify : {
        while (XCheckWindowEvent(dpy,_window,PointerMotionMask,&event)) {}
        _mouse_x = event.xmotion.x;
        _mouse_y = event.xmotion.y;
        if (_mouse_x<0 || _mouse_y<0 || _mouse_x>=width() || _mouse_y>=height()) _mouse_x = _mouse_y = -1;
        _is_event = true;
        pthread_cond_broadcast(&cimg::X11_attr().wait_event);
      } break;
      }
    }